

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_authorization.c
# Opt level: O0

int get_seconds_since_epoch(uint64_t *seconds)

{
  time_t stopTime;
  LOGGER_LOG p_Var1;
  double dVar2;
  LOGGER_LOG l;
  time_t current_time;
  int result;
  uint64_t *seconds_local;
  
  stopTime = get_time((time_t *)0x0);
  if (stopTime == -1) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_authorization.c"
                ,"get_seconds_since_epoch",0x2f,1,
                "Failed getting the current local time (get_time() failed)");
    }
    current_time._4_4_ = 0x30;
  }
  else {
    dVar2 = get_difftime(stopTime,0);
    *seconds = (long)dVar2 | (long)(dVar2 - 9.223372036854776e+18) & (long)dVar2 >> 0x3f;
    current_time._4_4_ = 0;
  }
  return current_time._4_4_;
}

Assistant:

static int get_seconds_since_epoch(uint64_t* seconds)
{
    int result;
    time_t current_time;
    if ((current_time = get_time(NULL)) == INDEFINITE_TIME)
    {
        LogError("Failed getting the current local time (get_time() failed)");
        result = MU_FAILURE;
    }
    else
    {
        *seconds = (uint64_t)get_difftime(current_time, (time_t)0);
        result = 0;
    }
    return result;
}